

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall
Js::JavascriptArray::SetArrayLiteralItem<void*>(JavascriptArray *this,uint32 index,void *value)

{
  code *pcVar1;
  bool bVar2;
  SparseArraySegmentBase **ppSVar3;
  SparseArraySegment<void_*> *pSVar4;
  undefined4 *puVar5;
  SparseArraySegment<void_*> *segment;
  void *value_local;
  uint32 index_local;
  JavascriptArray *this_local;
  
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&this->head);
  pSVar4 = SparseArraySegment<void_*>::From(*ppSVar3);
  if ((pSVar4->super_SparseArraySegmentBase).left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x9b6,"(segment->left == 0)","segment->left == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((pSVar4->super_SparseArraySegmentBase).length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x9b7,"(index < segment->length)","index < segment->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Memory::WriteBarrierPtr<void>::operator=
            ((WriteBarrierPtr<void> *)
             (&pSVar4[1].super_SparseArraySegmentBase.left + (ulong)index * 2),value);
  return;
}

Assistant:

void JavascriptArray::SetArrayLiteralItem(uint32 index, T value)
    {
        SparseArraySegment<T> * segment = SparseArraySegment<T>::From(this->head);

        Assert(segment->left == 0);
        Assert(index < segment->length);

        segment->elements[index] = value;
    }